

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::transform
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,AffineSpace3fa *space)

{
  LightNodeImpl<embree::SceneGraph::AmbientLight> *this_00;
  AmbientLight local_38;
  
  this_00 = (LightNodeImpl<embree::SceneGraph::AmbientLight> *)operator_new(0x90);
  local_38.super_Light.type = LIGHT_AMBIENT;
  local_38.L.field_0._0_8_ = *(undefined8 *)&space[2].l.vx.field_0;
  local_38.L.field_0._8_8_ = *(undefined8 *)((long)&space[2].l.vx.field_0 + 8);
  LightNodeImpl(this_00,&local_38);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }